

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

bool __thiscall
tinyusdz::GeomPrimvar::flatten_with_indices
          (GeomPrimvar *this,double t,Value *dest,TimeSampleInterpolationType tinterp,string *err)

{
  PrimVar *this_00;
  Attribute *this_01;
  bool bVar1;
  uint32_t uVar2;
  value_type_conflict *pvVar3;
  string *psVar4;
  uint *args;
  char cVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  storage_t<unsigned_int> elementSize;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded_val;
  bool local_f8;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value;
  vector<int,_std::allocator<int>_> indices;
  storage_union local_78;
  undefined1 *local_68;
  string err_msg;
  allocator local_39;
  string *local_38;
  
  if (dest == (Value *)0x0) {
    if (err == (string *)0x0) {
      return (bool)'\0';
    }
    std::__cxx11::string::append((char *)err);
    return (bool)'\0';
  }
  this_00 = &(this->_attr)._var;
  psVar4 = err;
  bVar1 = primvar::PrimVar::has_value(this_00);
  if ((!bVar1) &&
     (*(pointer *)
       ((long)&(this->_attr)._var._ts._samples.
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               ._M_impl.super__Vector_impl_data + 8) ==
      (this->_attr)._var._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    return (bool)'\0';
  }
  this_01 = &this->_attr;
  uVar2 = Attribute::type_id(this_01);
  bVar1 = IsSupportedGeomPrimvarType(uVar2);
  if (!bVar1) {
    if (err == (string *)0x0) {
      return (bool)'\0';
    }
    std::__cxx11::string::string
              ((string *)&value,"Unsupported type for GeomPrimvar. type = `{}`",
               (allocator *)&err_msg);
    Attribute::type_name_abi_cxx11_((string *)&expanded_val,this_01);
    fmt::format<std::__cxx11::string>((string *)&ret,(fmt *)&value,(string *)&expanded_val,psVar4);
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return (bool)'\0';
  }
  local_68 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_78.dynamic = (void *)0x0;
  local_38 = err;
  uVar2 = Attribute::type_id(this_01);
  if ((uVar2 >> 0x14 & 1) == 0) {
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)linb::any::vtable_for_type<decltype(nullptr)>()::table;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bVar1 = primvar::PrimVar::get_interpolated_value(this_00,t,tinterp,(Value *)&expanded_val);
    psVar4 = local_38;
    if (bVar1) {
      linb::any::operator=(&dest->v_,(any *)&expanded_val);
    }
    else if (local_38 != (string *)0x0) {
      std::__cxx11::string::string
                ((string *)&value,"Failed to evaluate Attribute value.",(allocator *)&err_msg);
      fmt::format((string *)&ret,(string *)&value);
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    if (expanded_val.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (*(code *)expanded_val.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[1]._M_dataplus._M_p)
                (&expanded_val);
    }
    cVar5 = '\0';
    goto LAB_00166a68;
  }
  err_msg._M_dataplus._M_p = (pointer)&err_msg.field_2;
  err_msg._M_string_length = 0;
  err_msg.field_2._M_local_buf[0] = '\0';
  if ((this->_attr)._metas.elementSize.has_value_ == false) {
    elementSize = (storage_t<unsigned_int>)0x1;
  }
  else {
    elementSize = (this->_attr)._metas.elementSize.contained;
  }
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (NAN(t)) {
    std::vector<int,_std::allocator<int>_>::operator=(&indices,&this->_indices);
  }
  else {
    TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::
    get<std::vector<int,_std::allocator<int>_>,_nullptr>(&this->_ts_indices,&indices,t,tinterp);
  }
  uVar2 = Attribute::type_id(this_01);
  cVar5 = '\0';
  args = &switchD_001641c9::switchdataD_002080c8;
  switch(uVar2) {
  case 0x100007:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      (this_01,t,&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::__cxx11::string>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=((any *)&local_78,&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&expanded_val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&value);
    break;
  default:
    goto switchD_001641c9_caseD_100008;
  case 0x100009:
    ret.contained.
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    ret.contained.
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length._0_4_ = 0;
    ret.contained.
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0._16_8_ = 0;
    ret.contained.
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0._24_4_ = 0;
    ret.contained.
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    ret.contained.
    super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._33_7_ = 0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)value.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<bool,std::allocator<bool>>>
                      (this_01,t,(vector<bool,_std::allocator<bool>_> *)&ret,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<bool>
                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&expanded_val,(vector<bool,_std::allocator<bool>_> *)&ret,(uint32_t)elementSize,
                 (vector<int,_std::allocator<int>_> *)args,
                 (vector<bool,_std::allocator<bool>_> *)&value);
      if (local_f8 == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&expanded_val);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=((any *)&local_78,(vector<bool,_std::allocator<bool>_> *)&value);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&expanded_val);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expanded_val);
    }
    else {
      cVar5 = '\0';
    }
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
              ((_Bvector_base<std::allocator<bool>_> *)&value);
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
              ((_Bvector_base<std::allocator<bool>_> *)&ret);
    break;
  case 0x10000e:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                      (this_01,t,
                       (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::half>
                (&ret,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                      &value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~_Vector_base
              ((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
               &expanded_val);
    std::_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~_Vector_base
              ((_Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)&value
              );
    break;
  case 0x10000f:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<int,std::allocator<int>>>
                      (this_01,t,(vector<int,_std::allocator<int>_> *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<int>
                (&ret,(vector<int,_std::allocator<int>_> *)&value,(uint32_t)elementSize,
                 (vector<int,_std::allocator<int>_> *)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=((any *)&local_78,(vector<int,_std::allocator<int>_> *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&expanded_val);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&value);
    break;
  case 0x100011:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<std::array<tinyusdz::value::half,2ul>,std::allocator<std::array<tinyusdz::value::half,2ul>>>>
                      (this_01,t,
                       (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<tinyusdz::value::half,2ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                  *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::
    _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     *)&expanded_val);
    std::
    _Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_2UL>,_std::allocator<std::array<tinyusdz::value::half,_2UL>_>_>
                     *)&value);
    break;
  case 0x100012:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                      (this_01,t,
                       (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<tinyusdz::value::half,3ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::
    _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     *)&expanded_val);
    std::
    _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                     *)&value);
    break;
  case 0x100013:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<std::array<tinyusdz::value::half,4ul>,std::allocator<std::array<tinyusdz::value::half,4ul>>>>
                      (this_01,t,
                       (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<tinyusdz::value::half,4ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                  *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::
    _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     *)&expanded_val);
    std::
    _Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
    ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_4UL>,_std::allocator<std::array<tinyusdz::value::half,_4UL>_>_>
                     *)&value);
    break;
  case 0x100014:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<std::array<int,2ul>,std::allocator<std::array<int,2ul>>>>
                      (this_01,t,
                       (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<int,2ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)
               &expanded_val);
    std::_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_> *)&value)
    ;
    break;
  case 0x100015:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>
                      (this_01,t,
                       (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<int,3ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
               &expanded_val);
    std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)&value)
    ;
    break;
  case 0x100016:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>>
                      (this_01,t,
                       (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<int,4ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)
               &expanded_val);
    std::_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)&value)
    ;
    break;
  case 0x10001b:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      (this_01,t,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&value,
                       tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<unsigned_int>
                (&ret,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&value,
                 (uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&expanded_val);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&value);
    break;
  case 0x100025:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<std::array<unsigned_int,2ul>,std::allocator<std::array<unsigned_int,2ul>>>>
                      (this_01,t,
                       (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,2ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                  *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::
    _Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   *)&expanded_val);
    std::
    _Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<unsigned_int,_2UL>,_std::allocator<std::array<unsigned_int,_2UL>_>_>
                   *)&value);
    break;
  case 0x100026:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<std::array<unsigned_int,3ul>,std::allocator<std::array<unsigned_int,3ul>>>>
                      (this_01,t,
                       (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,3ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                  *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::
    _Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                   *)&expanded_val);
    std::
    _Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<unsigned_int,_3UL>,_std::allocator<std::array<unsigned_int,_3UL>_>_>
                   *)&value);
    break;
  case 0x100027:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<std::array<unsigned_int,4ul>,std::allocator<std::array<unsigned_int,4ul>>>>
                      (this_01,t,
                       (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<unsigned_int,4ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)(ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                  *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::
    _Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                   *)&expanded_val);
    std::
    _Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
                   *)&value);
    break;
  case 0x100028:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<float,std::allocator<float>>>
                      (this_01,t,(vector<float,_std::allocator<float>_> *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<float>
                (&ret,(vector<float,_std::allocator<float>_> *)&value,(uint32_t)elementSize,
                 (vector<int,_std::allocator<int>_> *)args,
                 (vector<float,_std::allocator<float>_> *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,(vector<float,_std::allocator<float>_> *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&expanded_val);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&value);
    break;
  case 0x100029:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>>
                      (this_01,t,
                       (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<float,2ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                  &expanded_val);
    std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                  &value);
    break;
  case 0x10002a:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                      (this_01,t,
                       (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<float,3ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                  &expanded_val);
    std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                  &value);
    break;
  case 0x10002b:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                      (this_01,t,
                       (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<float,4ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)in_R9);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                  &expanded_val);
    std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                  &value);
    break;
  case 0x10002c:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::get<std::vector<double,std::allocator<double>>>
                      (this_01,t,(vector<double,_std::allocator<double>_> *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<double>
                (&ret,(vector<double,_std::allocator<double>_> *)&value,(uint32_t)elementSize,
                 (vector<int,_std::allocator<int>_> *)args,
                 (vector<double,_std::allocator<double>_> *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,(vector<double,_std::allocator<double>_> *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&expanded_val);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&value);
    break;
  case 0x10002d:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>
                      (this_01,t,
                       (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<double,2ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)in_R9
                );
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   *)&expanded_val);
    std::_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   *)&value);
    break;
  case 0x10002e:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>>
                      (this_01,t,
                       (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *
                       )&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<double,3ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)in_R9
                );
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   *)&expanded_val);
    std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   *)&value);
    break;
  case 0x10002f:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<std::array<double,4ul>,std::allocator<std::array<double,4ul>>>>
                      (this_01,t,
                       (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *
                       )&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      (anonymous_namespace)::ExpandWithIndices<std::array<double,4ul>>
                (&ret,(_anonymous_namespace_ *)&value,
                 (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                 (ulong)(uint)elementSize,(uint32_t)args,
                 (vector<int,_std::allocator<int>_> *)&expanded_val,
                 (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)in_R9
                );
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                   *)&expanded_val);
    std::_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>::
    ~_Vector_base((_Vector_base<std::array<double,_4UL>,_std::allocator<std::array<double,_4UL>_>_>
                   *)&value);
    break;
  case 0x100030:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::quath,std::allocator<tinyusdz::value::quath>>>
                      (this_01,t,
                       (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::quath>
                (&ret,(vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                      &value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                  &expanded_val);
    std::_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *)
                  &value);
    break;
  case 0x100031:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                      (this_01,t,
                       (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::quatf>
                (&ret,(vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                      &value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                  &expanded_val);
    std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                  &value);
    break;
  case 0x100032:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::quatd,std::allocator<tinyusdz::value::quatd>>>
                      (this_01,t,
                       (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                       &value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::quatd>
                (&ret,(vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                      &value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                  &expanded_val);
    std::_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::quatd,_std::allocator<tinyusdz::value::quatd>_> *)
                  &value);
    break;
  case 0x100036:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::matrix2d,std::allocator<tinyusdz::value::matrix2d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix2d>
                (&ret,(vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix2d,_std::allocator<tinyusdz::value::matrix2d>_>
                   *)&value);
    break;
  case 0x100037:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::matrix3d,std::allocator<tinyusdz::value::matrix3d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix3d>
                (&ret,(vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix3d,_std::allocator<tinyusdz::value::matrix3d>_>
                   *)&value);
    break;
  case 0x100038:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix4d>
                (&ret,(vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                   *)&value);
    break;
  case 0x10003a:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                      (this_01,t,
                       (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::color3f>
                (&ret,(vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *
                      )&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                   *)&value);
    break;
  case 0x10003b:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::color3d,std::allocator<tinyusdz::value::color3d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::color3d>
                (&ret,(vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *
                      )&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color3d,_std::allocator<tinyusdz::value::color3d>_>
                   *)&value);
    break;
  case 0x10003d:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::color4f,std::allocator<tinyusdz::value::color4f>>>
                      (this_01,t,
                       (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::color4f>
                (&ret,(vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *
                      )&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color4f,_std::allocator<tinyusdz::value::color4f>_>
                   *)&value);
    break;
  case 0x10003e:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::color4d,std::allocator<tinyusdz::value::color4d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::color4d>
                (&ret,(vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *
                      )&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::color4d,_std::allocator<tinyusdz::value::color4d>_>
                   *)&value);
    break;
  case 0x10003f:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::point3h,std::allocator<tinyusdz::value::point3h>>>
                      (this_01,t,
                       (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3h>
                (&ret,(vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *
                      )&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
                   *)&value);
    break;
  case 0x100040:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
                      (this_01,t,
                       (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3f>
                (&ret,(vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *
                      )&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                   *)&value);
    break;
  case 0x100041:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::point3d,std::allocator<tinyusdz::value::point3d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::point3d>
                (&ret,(vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *
                      )&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_> *)
                     &expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::point3d,_std::allocator<tinyusdz::value::point3d>_>
                   *)&value);
    break;
  case 0x100042:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::normal3h,std::allocator<tinyusdz::value::normal3h>>>
                      (this_01,t,
                       (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3h>
                (&ret,(vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::normal3h,_std::allocator<tinyusdz::value::normal3h>_>
                   *)&value);
    break;
  case 0x100043:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                      (this_01,t,
                       (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3f>
                (&ret,(vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                   *)&value);
    break;
  case 0x100044:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::normal3d,std::allocator<tinyusdz::value::normal3d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3d>
                (&ret,(vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::normal3d,_std::allocator<tinyusdz::value::normal3d>_>
                   *)&value);
    break;
  case 0x100045:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::vector3h,std::allocator<tinyusdz::value::vector3h>>>
                      (this_01,t,
                       (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::vector3h>
                (&ret,(vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::vector3h,_std::allocator<tinyusdz::value::vector3h>_>
                   *)&value);
    break;
  case 0x100046:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                      (this_01,t,
                       (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::vector3f>
                (&ret,(vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                   *)&value);
    break;
  case 0x100047:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::vector3d,std::allocator<tinyusdz::value::vector3d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::vector3d>
                (&ret,(vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_> *)
                 &expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::vector3d,_std::allocator<tinyusdz::value::vector3d>_>
                   *)&value);
    break;
  case 0x100049:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::texcoord2h,std::allocator<tinyusdz::value::texcoord2h>>>
                      (this_01,t,
                       (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord2h>
                (&ret,(vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                  *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2h,_std::allocator<tinyusdz::value::texcoord2h>_>
                   *)&value);
    break;
  case 0x10004a:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                      (this_01,t,
                       (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord2f>
                (&ret,(vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                  *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                   *)&value);
    break;
  case 0x10004b:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::texcoord2d,std::allocator<tinyusdz::value::texcoord2d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord2d>
                (&ret,(vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                  *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2d,_std::allocator<tinyusdz::value::texcoord2d>_>
                   *)&value);
    break;
  case 0x10004c:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::texcoord3h,std::allocator<tinyusdz::value::texcoord3h>>>
                      (this_01,t,
                       (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3h>
                (&ret,(vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                  *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                   *)&value);
    break;
  case 0x10004d:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                      (this_01,t,
                       (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3f>
                (&ret,(vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                  *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
                   *)&value);
    break;
  case 0x10004e:
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    value.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded_val.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = Attribute::
            get<std::vector<tinyusdz::value::texcoord3d,std::allocator<tinyusdz::value::texcoord3d>>>
                      (this_01,t,
                       (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                        *)&value,tinterp);
    if (bVar1) {
      args = (uint *)&indices;
      anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3d>
                (&ret,(vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                       *)&value,(uint32_t)elementSize,(vector<int,_std::allocator<int>_> *)args,
                 (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                  *)&expanded_val);
      if (ret.contained.
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value == true) {
        pvVar3 = nonstd::expected_lite::
                 expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&ret);
        cVar5 = *pvVar3;
        if ((value_type_conflict)cVar5 == true) {
          linb::any::operator=
                    ((any *)&local_78,
                     (vector<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                      *)&expanded_val);
        }
      }
      else {
        nonstd::expected_lite::
        expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error(&ret);
        std::__cxx11::string::_M_assign((string *)&err_msg);
        cVar5 = '\0';
      }
      nonstd::expected_lite::
      expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~expected(&ret);
    }
    else {
      cVar5 = '\0';
    }
    std::_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                   *)&expanded_val);
    std::_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>::
    ~_Vector_base((_Vector_base<tinyusdz::value::texcoord3d,_std::allocator<tinyusdz::value::texcoord3d>_>
                   *)&value);
  }
  if (cVar5 == '\0') {
switchD_001641c9_caseD_100008:
    psVar4 = local_38;
    if (local_38 != (string *)0x0) {
      std::__cxx11::string::string
                ((string *)&value,"[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
                 &local_39);
      Attribute::type_name_abi_cxx11_((string *)&expanded_val,this_01);
      fmt::format<std::__cxx11::string>
                ((string *)&ret,(fmt *)&value,(string *)&expanded_val,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
      std::__cxx11::string::append((string *)psVar4);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      if (err_msg._M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                       "\n",&err_msg);
        std::__cxx11::string::append((string *)psVar4);
        std::__cxx11::string::_M_dispose();
      }
    }
  }
  else {
    linb::any::operator=(&dest->v_,(any *)&local_78);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indices.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::_M_dispose();
  bVar1 = true;
LAB_00166a68:
  if (local_68 != (undefined1 *)0x0) {
    (**(code **)(local_68 + 0x20))(&local_78);
  }
  if (bVar1 == false) {
    return false;
  }
  return (bool)cVar5;
}

Assistant:

bool GeomPrimvar::flatten_with_indices(const double t, value::Value *dest, const value::TimeSampleInterpolationType tinterp, std::string *err) const {

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  bool processed = false;

  if (_attr.has_value() || _attr.has_timesamples()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    value::Value val;

    if (!(_attr.type_id() & value::TYPE_ID_1D_ARRAY_BIT)) {

      // evaluate value at specified time and return it for scalar type.
      value::Value v;
      if (!_attr.get_var().get_interpolated_value(t, tinterp, &v)) {
        if (err) {
          (*err) += fmt::format("Failed to evaluate Attribute value.");
        }
        return false;
      }
      (*dest) = v;
    } else {
      std::string err_msg;

      uint32_t elementSize = _attr.metas().elementSize.value_or(1);

      std::vector<int32_t> indices;
      // Get indices at specified time
      if (value::TimeCode(t).is_default()) {
        indices = _indices;
      } else {
        _ts_indices.get(&indices, t, tinterp);
      }

#define APPLY_FUN(__ty)                                                  \
  case value::TypeTraits<__ty>::type_id() | value::TYPE_ID_1D_ARRAY_BIT: { \
    std::vector<__ty> value; \
    std::vector<__ty> expanded_val;                                      \
    if (_attr.get_value(t, &value, tinterp)) {                \
      auto ret = ExpandWithIndices(value, elementSize, indices, &expanded_val); \
      if (ret) {                                                         \
        processed = ret.value();                                         \
        if (processed) {                                                 \
          val = expanded_val;                                            \
        }                                                                \
      } else {                                                           \
        err_msg = ret.error();                                           \
      }                                                                  \
    }                                                                    \
    break;                                                               \
  }

      switch (_attr.type_id()) {
        APPLY_GEOMPRIVAR_TYPE(APPLY_FUN)
        default: {
          processed = false;
        }
      }

#undef APPLY_FUN

      if (processed) {
        (*dest) = std::move(val);
      } else {
        if (err) {
          (*err) += fmt::format(
              "[Internal Error] Failed to expand for GeomPrimvar type = `{}`",
              _attr.type_name());
          if (err_msg.size()) {
            (*err) += "\n" + err_msg;
          }
        }
      }
    }
  }

  return processed;
}